

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

void __thiscall cmCTestHG::LogParser::EndElement(LogParser *this,string *name)

{
  pointer pCVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  string *psVar6;
  Change *change;
  pointer pCVar7;
  string *path;
  pointer pbVar8;
  string added_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  long *local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])
              (this->HG,&this->Rev,&this->Changes);
    goto LAB_005bab1b;
  }
  if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_finish) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
    if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
      if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
        if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish) ||
           (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
          if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start ==
               (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish) ||
             (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
            if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
               (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
              if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish) ||
                 (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0))
              goto LAB_005bab1b;
              local_78 = &local_68;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((string *)&local_78,
                         (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              pCVar1 = (this->Changes).
                       super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pCVar7 = (this->Changes).
                            super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                            ._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar1;
                  pCVar7 = pCVar7 + 1) {
                lVar4 = std::__cxx11::string::find
                                  ((char *)&local_78,(ulong)(pCVar7->Path)._M_dataplus._M_p,0);
                if (lVar4 != -1) {
                  pCVar7->Action = 'D';
                }
              }
            }
            else {
              local_78 = &local_68;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((string *)&local_78,
                         (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              pCVar1 = (this->Changes).
                       super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pCVar7 = (this->Changes).
                            super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                            ._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar1;
                  pCVar7 = pCVar7 + 1) {
                lVar4 = std::__cxx11::string::find
                                  ((char *)&local_78,(ulong)(pCVar7->Path)._M_dataplus._M_p,0);
                if (lVar4 != -1) {
                  pCVar7->Action = 'A';
                }
              }
            }
            if (local_78 != &local_68) {
              operator_delete(local_78,local_68 + 1);
            }
          }
          else {
            SplitCData_abi_cxx11_(&local_48,this);
            local_50 = local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              psVar6 = &(this->CurChange).Path;
              pbVar8 = local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_78 = (long *)CONCAT71(local_78._1_7_,0x55);
                local_68 = 0;
                local_60 = 0;
                (this->CurChange).Action = 'U';
                local_70 = &local_60;
                std::__cxx11::string::operator=((string *)psVar6,(string *)&local_70);
                if (local_70 != &local_60) {
                  operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
                }
                std::__cxx11::string::_M_assign((string *)psVar6);
                std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                push_back(&this->Changes,&this->CurChange);
                pbVar8 = pbVar8 + 1;
              } while (pbVar8 != local_50);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
          }
          goto LAB_005bab1b;
        }
        psVar6 = &(this->Rev).Log;
        pcVar5 = (char *)(this->Rev).Log._M_string_length;
      }
      else {
        psVar6 = &(this->Rev).Date;
        pcVar5 = (char *)(this->Rev).Date._M_string_length;
      }
    }
    else {
      psVar6 = &(this->Rev).EMail;
      pcVar5 = (char *)(this->Rev).EMail._M_string_length;
    }
  }
  else {
    psVar6 = &(this->Rev).Author;
    pcVar5 = (char *)(this->Rev).Author._M_string_length;
  }
  std::__cxx11::string::_M_replace
            ((ulong)psVar6,0,pcVar5,
             (ulong)(this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
LAB_005bab1b:
  pcVar2 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar2) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "logentry") {
      this->HG->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() && name == "author") {
      this->Rev.Author.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "email") {
      this->Rev.EMail.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "date") {
      this->Rev.Date.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "msg") {
      this->Rev.Log.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "files") {
      std::vector<std::string> paths = this->SplitCData();
      for (std::string const& path : paths) {
        // Updated by default, will be modified using file_adds and
        // file_dels.
        this->CurChange = Change('U');
        this->CurChange.Path = path;
        this->Changes.push_back(this->CurChange);
      }
    } else if (!this->CData.empty() && name == "file_adds") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (Change& change : this->Changes) {
        if (added_paths.find(change.Path) != std::string::npos) {
          change.Action = 'A';
        }
      }
    } else if (!this->CData.empty() && name == "file_dels") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (Change& change : this->Changes) {
        if (added_paths.find(change.Path) != std::string::npos) {
          change.Action = 'D';
        }
      }
    }
    this->CData.clear();
  }